

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int lua_yieldk(lua_State *L,int nresults,lua_KContext ctx,lua_KFunction k)

{
  int iVar1;
  int *piVar2;
  CallInfo *pCVar3;
  StkId pTVar4;
  char *fmt;
  
  piVar2 = *(int **)&L[-1].hookmask;
  pCVar3 = L->ci;
  iVar1 = *piVar2;
  *piVar2 = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x324,"int lua_yieldk(lua_State *, int, lua_KContext, lua_KFunction)");
  }
  pTVar4 = pCVar3->func;
  if ((long)L->top - (long)pTVar4 >> 4 <= (long)nresults) {
    __assert_fail("((nresults) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x325,"int lua_yieldk(lua_State *, int, lua_KContext, lua_KFunction)");
  }
  if (L->nny != 0) {
    if (L->l_G->mainthread == L) {
      fmt = "attempt to yield from outside a coroutine";
    }
    else {
      fmt = "attempt to yield across a C-call boundary";
    }
    luaG_runerror(L,fmt);
  }
  L->status = '\x01';
  pCVar3->extra = (long)pTVar4 - (long)L->stack;
  if ((pCVar3->callstatus & 2) != 0) {
    if (k != (lua_KFunction)0x0) {
      __assert_fail("(k == ((void*)0)) && \"hooks cannot continue after yielding\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x32f,"int lua_yieldk(lua_State *, int, lua_KContext, lua_KFunction)");
    }
    if ((pCVar3->callstatus & 4) != 0) {
      *piVar2 = 0;
      return 0;
    }
    __assert_fail("ci->callstatus & (1<<2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x337,"int lua_yieldk(lua_State *, int, lua_KContext, lua_KFunction)");
  }
  (pCVar3->u).c.k = k;
  if (k != (lua_KFunction)0x0) {
    (pCVar3->u).c.ctx = ctx;
  }
  pCVar3->func = L->top + (-1 - (long)nresults);
  luaD_throw(L,1);
}

Assistant:

LUA_API int lua_yieldk (lua_State *L, int nresults, lua_KContext ctx,
                        lua_KFunction k) {
  CallInfo *ci = L->ci;
  luai_userstateyield(L, nresults);
  lua_lock(L);
  api_checknelems(L, nresults);
  if (L->nny > 0) {
    if (L != G(L)->mainthread)
      luaG_runerror(L, "attempt to yield across a C-call boundary");
    else
      luaG_runerror(L, "attempt to yield from outside a coroutine");
  }
  L->status = LUA_YIELD;
  ci->extra = savestack(L, ci->func);  /* save current 'func' */
  if (isLua(ci)) {  /* inside a hook? */
    api_check(L, k == NULL, "hooks cannot continue after yielding");
  }
  else {
    if ((ci->u.c.k = k) != NULL)  /* is there a continuation? */
      ci->u.c.ctx = ctx;  /* save context */
    ci->func = L->top - nresults - 1;  /* protect stack below results */
    luaD_throw(L, LUA_YIELD);
  }
  lua_assert(ci->callstatus & CIST_HOOKED);  /* must be inside a hook */
  lua_unlock(L);
  return 0;  /* return to 'luaD_hook' */
}